

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O3

vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
* __thiscall
duckdb::Binder::BindNewConstraints
          (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
           *__return_storage_ptr__,Binder *this,
          vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
          *constraints,string *table_name,ColumnList *columns)

{
  pointer puVar1;
  _Hash_node_base *p_Var2;
  pointer pcVar3;
  bool bVar4;
  pointer pPVar5;
  pointer pBVar6;
  BoundUniqueConstraint *pBVar7;
  BoundNotNullConstraint *pBVar8;
  size_type sVar9;
  LogicalIndex index;
  NotNullConstraint *this_00;
  ParserException *this_01;
  pointer __k;
  pointer this_02;
  vector<duckdb::PhysicalIndex,_true> primary_keys;
  physical_index_set_t not_null_columns;
  string local_d8;
  vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> local_b8;
  string *local_a0;
  vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
  *local_98;
  ColumnList *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_98 = (vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
              *)constraints;
  local_90 = columns;
  BindConstraints(__return_storage_ptr__,this,constraints,table_name,columns);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_b8.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_start = (key_type *)0x0;
  local_b8.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_b8.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_02 = (__return_storage_ptr__->
            super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (__return_storage_ptr__->
           super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_02 != puVar1) {
    bVar4 = false;
    local_a0 = table_name;
    do {
      pBVar6 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               ::operator->(this_02);
      if (pBVar6->type == NOT_NULL) {
        pBVar6 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                 ::operator->(this_02);
        pBVar8 = BoundConstraint::Cast<duckdb::BoundNotNullConstraint>(pBVar6);
        local_d8._M_dataplus._M_p = (pointer)&local_68;
        ::std::
        _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<duckdb::PhysicalIndex_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::PhysicalIndex,true>>>>
                  ((_Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_68,&pBVar8->index,&local_d8);
      }
      else if (pBVar6->type == UNIQUE) {
        pBVar6 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                 ::operator->(this_02);
        pBVar7 = BoundConstraint::Cast<duckdb::BoundUniqueConstraint>(pBVar6);
        if (pBVar7->is_primary_key == true) {
          if (bVar4) {
            this_01 = (ParserException *)__cxa_allocate_exception(0x10);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,"table \"%s\" has more than one primary key","");
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            pcVar3 = (local_a0->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,pcVar3,pcVar3 + local_a0->_M_string_length);
            ParserException::ParserException<std::__cxx11::string>(this_01,&local_d8,&local_88);
            __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar4 = true;
          ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::operator=
                    (&local_b8,
                     &(pBVar7->keys).
                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>);
        }
      }
      pPVar5 = local_b8.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      this_02 = this_02 + 1;
    } while (this_02 != puVar1);
    if ((bVar4) &&
       (local_b8.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_b8.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      __k = local_b8.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_start;
      do {
        sVar9 = ::std::
                _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count(&local_68,__k);
        if (sVar9 == 0) {
          index = ColumnList::PhysicalToLogical(local_90,__k->index);
          this_00 = (NotNullConstraint *)operator_new(0x18);
          NotNullConstraint::NotNullConstraint(this_00,index);
          local_d8._M_dataplus._M_p = (pointer)this_00;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                    (local_98,(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                               *)&local_d8);
          if ((NotNullConstraint *)local_d8._M_dataplus._M_p != (NotNullConstraint *)0x0) {
            (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
          }
          local_d8._M_dataplus._M_p = (pointer)operator_new(0x18);
          p_Var2 = (_Hash_node_base *)__k->index;
          *(undefined1 *)
           &((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_d8._M_dataplus._M_p)->_M_bucket_count = 1;
          ((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)local_d8._M_dataplus._M_p)->_M_buckets = (__buckets_ptr)&PTR__BoundConstraint_0244c368
          ;
          (((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)local_d8._M_dataplus._M_p)->_M_before_begin)._M_nxt = p_Var2;
          ::std::
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>>>
                      *)__return_storage_ptr__,
                     (unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                      *)&local_d8);
          if ((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_d8._M_dataplus._M_p !=
              (_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)0x0) {
            (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
          }
        }
        __k = __k + 1;
      } while (__k != pPVar5);
    }
    if (local_b8.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
        _M_impl.super__Vector_impl_data._M_start != (key_type *)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  ::std::
  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

vector<unique_ptr<BoundConstraint>> Binder::BindNewConstraints(vector<unique_ptr<Constraint>> &constraints,
                                                               const string &table_name, const ColumnList &columns) {
	auto bound_constraints = BindConstraints(constraints, table_name, columns);

	// Handle PK and NOT NULL constraints.
	bool has_primary_key = false;
	physical_index_set_t not_null_columns;
	vector<PhysicalIndex> primary_keys;

	for (const auto &bound_constr : bound_constraints) {
		switch (bound_constr->type) {
		case ConstraintType::NOT_NULL: {
			auto &not_null = bound_constr->Cast<BoundNotNullConstraint>();
			not_null_columns.insert(not_null.index);
			break;
		}
		case ConstraintType::UNIQUE: {
			const auto &unique = bound_constr->Cast<BoundUniqueConstraint>();
			if (unique.is_primary_key) {
				if (has_primary_key) {
					throw ParserException("table \"%s\" has more than one primary key", table_name);
				}
				has_primary_key = true;
				primary_keys = unique.keys;
			}
			break;
		}
		default:
			break;
		}
	}

	if (has_primary_key) {
		// Create a PK constraint, and a NOT NULL constraint for each indexed column.
		for (auto &column_index : primary_keys) {
			if (not_null_columns.count(column_index) != 0) {
				continue;
			}

			auto logical_index = columns.PhysicalToLogical(column_index);
			constraints.push_back(make_uniq<NotNullConstraint>(logical_index));
			bound_constraints.push_back(make_uniq<BoundNotNullConstraint>(column_index));
		}
	}

	return bound_constraints;
}